

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

bool NeedIoC(void)

{
  char *pcVar1;
  int iVar2;
  
  SkipBlanks();
  pcVar1 = lp;
  if (((*lp == '(') && (iVar2 = tolower((uint)(byte)lp[1]), iVar2 == 99)) && (pcVar1[2] == ')')) {
    lp = pcVar1 + 3;
    return true;
  }
  return false;
}

Assistant:

bool NeedIoC() {
	SkipBlanks();
	if ('(' != lp[0] || 'c' != tolower((byte)lp[1]) || ')' != lp[2]) return false;
	lp += 3;
	return true;
}